

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O2

void remove_filelist(HtsVoiceFilelist *list)

{
  HtsVoiceFilelist *__ptr;
  
  __ptr = (HtsVoiceFilelist *)0x0;
  while( true ) {
    free(__ptr);
    if (list == (HtsVoiceFilelist *)0x0) break;
    free((list->field_1).pathSjis);
    free((list->field_2).nameSjis);
    __ptr = list;
    list = list->succ;
  }
  return;
}

Assistant:

void remove_filelist(HtsVoiceFilelist *list)
{
	HtsVoiceFilelist *prev = NULL;
	while (list != NULL)
	{
		if (prev != NULL)
		{
			free(prev);
		}
		if (list->path)
		{
			free(list->path);
		}
		if (list->name)
		{
			free(list->name);
		}
		prev = list;
		list = list->succ;
	}
	if (prev != NULL)
	{
		free(prev);
	}
}